

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O2

int DispatchAlpha_SSE2(uint8_t *alpha,int alpha_stride,int width,int height,uint8_t *dst,
                      int dst_stride)

{
  byte bVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [14];
  undefined1 auVar4 [15];
  undefined1 auVar5 [14];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [13];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  unkuint9 Var22;
  undefined1 auVar23 [11];
  undefined1 auVar24 [13];
  undefined1 auVar25 [14];
  undefined1 auVar26 [13];
  undefined1 auVar27 [15];
  undefined1 auVar28 [11];
  undefined1 auVar29 [13];
  undefined1 auVar30 [14];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  int iVar35;
  ulong uVar36;
  byte bVar37;
  long lVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  ushort uVar43;
  undefined1 uVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  uint uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  
  auVar40 = _DAT_001a8f90;
  iVar35 = 0;
  if (height < 1) {
    height = 0;
  }
  bVar37 = 0xff;
  auVar41._8_4_ = 0xffffffff;
  auVar41._0_8_ = 0xffffffffffffffff;
  auVar41._12_4_ = 0xffffffff;
  auVar39._8_4_ = 0xffffffff;
  auVar39._0_8_ = 0xffffffffffffffff;
  auVar39._12_4_ = 0xffffffff;
  for (; iVar35 != height; iVar35 = iVar35 + 1) {
    for (lVar38 = 0x10; lVar38 < width; lVar38 = lVar38 + 0x10) {
      auVar42 = *(undefined1 (*) [16])(alpha + lVar38 + -0x10);
      auVar39 = auVar39 & auVar42;
      uVar49 = CONCAT13(0,CONCAT12(auVar42[9],(ushort)auVar42[8]));
      auVar2[0xd] = 0;
      auVar2._0_13_ = auVar42._0_13_;
      auVar2[0xe] = auVar42[7];
      auVar6[0xc] = auVar42[6];
      auVar6._0_12_ = auVar42._0_12_;
      auVar6._13_2_ = auVar2._13_2_;
      auVar8[0xb] = 0;
      auVar8._0_11_ = auVar42._0_11_;
      auVar8._12_3_ = auVar6._12_3_;
      auVar12[10] = auVar42[5];
      auVar12._0_10_ = auVar42._0_10_;
      auVar12._11_4_ = auVar8._11_4_;
      auVar15[9] = 0;
      auVar15._0_9_ = auVar42._0_9_;
      auVar15._10_5_ = auVar12._10_5_;
      auVar17[8] = auVar42[4];
      auVar17._0_8_ = auVar42._0_8_;
      auVar17._9_6_ = auVar15._9_6_;
      auVar21._7_8_ = 0;
      auVar21._0_7_ = auVar17._8_7_;
      Var22 = CONCAT81(SUB158(auVar21 << 0x40,7),auVar42[3]);
      auVar31._9_6_ = 0;
      auVar31._0_9_ = Var22;
      auVar23._1_10_ = SUB1510(auVar31 << 0x30,5);
      auVar23[0] = auVar42[2];
      auVar32._11_4_ = 0;
      auVar32._0_11_ = auVar23;
      auVar24._1_12_ = SUB1512(auVar32 << 0x20,3);
      auVar24[0] = auVar42[1];
      uVar43 = CONCAT11(0,auVar42[0]);
      auVar19._2_13_ = auVar24;
      auVar19._0_2_ = uVar43;
      auVar3._10_2_ = 0;
      auVar3._0_10_ = auVar19._0_10_;
      auVar3._12_2_ = (short)Var22;
      auVar25._2_4_ = auVar3._10_4_;
      auVar25._0_2_ = auVar23._0_2_;
      auVar25._6_8_ = 0;
      auVar52._6_8_ = SUB148(auVar25 << 0x40,6);
      auVar52._4_2_ = auVar24._0_2_;
      auVar52._2_2_ = 0;
      auVar52._0_2_ = uVar43;
      auVar52._14_2_ = 0;
      maskmovdqu(auVar52,auVar40);
      auVar44._2_2_ = 0;
      auVar44._0_2_ = auVar17._8_2_;
      auVar44._4_2_ = auVar12._10_2_;
      auVar44._6_2_ = 0;
      auVar44._8_2_ = auVar6._12_2_;
      auVar44._10_2_ = 0;
      auVar44[0xc] = auVar42[7];
      auVar44._13_3_ = 0;
      maskmovdqu(auVar44,auVar40);
      auVar9[0xc] = auVar42[0xb];
      auVar9._0_12_ = ZEXT112(auVar42[0xc]) << 0x40;
      auVar10._10_3_ = auVar9._10_3_;
      auVar10._0_10_ = (unkuint10)auVar42[10] << 0x40;
      auVar26._5_8_ = 0;
      auVar26._0_5_ = auVar10._8_5_;
      auVar13[4] = auVar42[9];
      auVar13._0_4_ = uVar49;
      auVar13[5] = 0;
      auVar13._6_7_ = SUB137(auVar26 << 0x40,6);
      auVar45._0_4_ = uVar49 & 0xffff;
      auVar45._4_9_ = auVar13._4_9_;
      auVar45._13_3_ = 0;
      maskmovdqu(auVar45,auVar40);
      auVar50._1_3_ = 0;
      auVar50[0] = auVar42[0xc];
      auVar50[4] = auVar42[0xd];
      auVar50._5_3_ = 0;
      auVar50[8] = auVar42[0xe];
      auVar50._9_3_ = 0;
      auVar50[0xc] = auVar42[0xf];
      auVar50._13_3_ = 0;
      maskmovdqu(auVar50,auVar40);
    }
    if ((int)(lVar38 - 8U) < width) {
      uVar36 = *(ulong *)(alpha + lVar38 + -0x10);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar36;
      auVar41 = auVar41 & auVar46;
      uVar48 = (undefined1)(uVar36 >> 0x38);
      auVar4._8_6_ = 0;
      auVar4._0_8_ = uVar36;
      auVar4[0xe] = uVar48;
      auVar7._8_4_ = 0;
      auVar7._0_8_ = uVar36;
      auVar7[0xc] = (char)(uVar36 >> 0x30);
      auVar7._13_2_ = auVar4._13_2_;
      auVar11._8_4_ = 0;
      auVar11._0_8_ = uVar36;
      auVar11._12_3_ = auVar7._12_3_;
      auVar14._8_2_ = 0;
      auVar14._0_8_ = uVar36;
      auVar14[10] = (char)(uVar36 >> 0x28);
      auVar14._11_4_ = auVar11._11_4_;
      auVar16._8_2_ = 0;
      auVar16._0_8_ = uVar36;
      auVar16._10_5_ = auVar14._10_5_;
      auVar18[8] = (char)(uVar36 >> 0x20);
      auVar18._0_8_ = uVar36;
      auVar18._9_6_ = auVar16._9_6_;
      auVar27._7_8_ = 0;
      auVar27._0_7_ = auVar18._8_7_;
      Var22 = CONCAT81(SUB158(auVar27 << 0x40,7),(char)(uVar36 >> 0x18));
      auVar33._9_6_ = 0;
      auVar33._0_9_ = Var22;
      auVar28._1_10_ = SUB1510(auVar33 << 0x30,5);
      auVar28[0] = (char)(uVar36 >> 0x10);
      auVar34._11_4_ = 0;
      auVar34._0_11_ = auVar28;
      auVar29._1_12_ = SUB1512(auVar34 << 0x20,3);
      auVar29[0] = (char)(uVar36 >> 8);
      uVar43 = CONCAT11(0,(byte)uVar36);
      auVar20._2_13_ = auVar29;
      auVar20._0_2_ = uVar43;
      auVar5._10_2_ = 0;
      auVar5._0_10_ = auVar20._0_10_;
      auVar5._12_2_ = (short)Var22;
      auVar30._2_4_ = auVar5._10_4_;
      auVar30._0_2_ = auVar28._0_2_;
      auVar30._6_8_ = 0;
      auVar51._6_8_ = SUB148(auVar30 << 0x40,6);
      auVar51._4_2_ = auVar29._0_2_;
      auVar51._2_2_ = 0;
      auVar51._0_2_ = uVar43;
      auVar51._14_2_ = 0;
      maskmovdqu(auVar51,auVar40);
      auVar47._2_2_ = 0;
      auVar47._0_2_ = auVar18._8_2_;
      auVar47._4_2_ = auVar14._10_2_;
      auVar47._6_2_ = 0;
      auVar47._8_2_ = auVar7._12_2_;
      auVar47._10_2_ = 0;
      auVar47[0xc] = uVar48;
      auVar47._13_3_ = 0;
      maskmovdqu(auVar47,auVar40);
      uVar36 = lVar38 - 8U & 0xffffffff;
    }
    else {
      uVar36 = lVar38 - 0x10;
    }
    for (uVar36 = uVar36 & 0xffffffff; (long)uVar36 < (long)width; uVar36 = uVar36 + 1) {
      bVar1 = alpha[uVar36];
      dst[uVar36 * 4] = bVar1;
      bVar37 = bVar37 & bVar1;
    }
    alpha = alpha + alpha_stride;
    dst = dst + dst_stride;
  }
  auVar42[0] = -(auVar41[0] == -1);
  auVar42[1] = -(auVar41[1] == -1);
  auVar42[2] = -(auVar41[2] == -1);
  auVar42[3] = -(auVar41[3] == -1);
  auVar42[4] = -(auVar41[4] == -1);
  auVar42[5] = -(auVar41[5] == -1);
  auVar42[6] = -(auVar41[6] == -1);
  auVar42[7] = -(auVar41[7] == -1);
  auVar42[8] = -(auVar41[8] == -1);
  auVar42[9] = -(auVar41[9] == -1);
  auVar42[10] = -(auVar41[10] == -1);
  auVar42[0xb] = -(auVar41[0xb] == -1);
  auVar42[0xc] = -(auVar41[0xc] == -1);
  auVar42[0xd] = -(auVar41[0xd] == -1);
  auVar42[0xe] = -(auVar41[0xe] == -1);
  auVar42[0xf] = -(auVar41[0xf] == -1);
  auVar40[0] = -(auVar39[0] == -1);
  auVar40[1] = -(auVar39[1] == -1);
  auVar40[2] = -(auVar39[2] == -1);
  auVar40[3] = -(auVar39[3] == -1);
  auVar40[4] = -(auVar39[4] == -1);
  auVar40[5] = -(auVar39[5] == -1);
  auVar40[6] = -(auVar39[6] == -1);
  auVar40[7] = -(auVar39[7] == -1);
  auVar40[8] = -(auVar39[8] == -1);
  auVar40[9] = -(auVar39[9] == -1);
  auVar40[10] = -(auVar39[10] == -1);
  auVar40[0xb] = -(auVar39[0xb] == -1);
  auVar40[0xc] = -(auVar39[0xc] == -1);
  auVar40[0xd] = -(auVar39[0xd] == -1);
  auVar40[0xe] = -(auVar39[0xe] == -1);
  auVar40[0xf] = -(auVar39[0xf] == -1);
  return (int)((ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar40[0xf] >> 7) << 0xf) != 0xffff ||
              ((SUB161(auVar42 >> 7,0) & 1 | (SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                (SUB161(auVar42 >> 0x17,0) & 1) << 2 | (SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                (SUB161(auVar42 >> 0x27,0) & 1) << 4 | (SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                (SUB161(auVar42 >> 0x37,0) & 1) << 6 | SUB161(auVar42 >> 0x3f,0) << 7) & bVar37) !=
              0xff);
}

Assistant:

static int DispatchAlpha_SSE2(const uint8_t* WEBP_RESTRICT alpha,
                              int alpha_stride, int width, int height,
                              uint8_t* WEBP_RESTRICT dst, int dst_stride) {
  // alpha_and stores an 'and' operation of all the alpha[] values. The final
  // value is not 0xff if any of the alpha[] is not equal to 0xff.
  uint32_t alpha_and = 0xff;
  int i, j;
  const __m128i zero = _mm_setzero_si128();
  const __m128i alpha_mask = _mm_set1_epi32((int)0xff);  // to preserve A
  const __m128i all_0xff = _mm_set1_epi8((char)0xff);
  __m128i all_alphas16 = all_0xff;
  __m128i all_alphas8 = all_0xff;

  // We must be able to access 3 extra bytes after the last written byte
  // 'dst[4 * width - 4]', because we don't know if alpha is the first or the
  // last byte of the quadruplet.
  for (j = 0; j < height; ++j) {
    char* ptr = (char*)dst;
    for (i = 0; i + 16 <= width - 1; i += 16) {
      // load 16 alpha bytes
      const __m128i a0 = _mm_loadu_si128((const __m128i*)&alpha[i]);
      const __m128i a1_lo = _mm_unpacklo_epi8(a0, zero);
      const __m128i a1_hi = _mm_unpackhi_epi8(a0, zero);
      const __m128i a2_lo_lo = _mm_unpacklo_epi16(a1_lo, zero);
      const __m128i a2_lo_hi = _mm_unpackhi_epi16(a1_lo, zero);
      const __m128i a2_hi_lo = _mm_unpacklo_epi16(a1_hi, zero);
      const __m128i a2_hi_hi = _mm_unpackhi_epi16(a1_hi, zero);
      _mm_maskmoveu_si128(a2_lo_lo, alpha_mask, ptr + 0);
      _mm_maskmoveu_si128(a2_lo_hi, alpha_mask, ptr + 16);
      _mm_maskmoveu_si128(a2_hi_lo, alpha_mask, ptr + 32);
      _mm_maskmoveu_si128(a2_hi_hi, alpha_mask, ptr + 48);
      // accumulate 16 alpha 'and' in parallel
      all_alphas16 = _mm_and_si128(all_alphas16, a0);
      ptr += 64;
    }
    if (i + 8 <= width - 1) {
      // load 8 alpha bytes
      const __m128i a0 = _mm_loadl_epi64((const __m128i*)&alpha[i]);
      const __m128i a1 = _mm_unpacklo_epi8(a0, zero);
      const __m128i a2_lo = _mm_unpacklo_epi16(a1, zero);
      const __m128i a2_hi = _mm_unpackhi_epi16(a1, zero);
      _mm_maskmoveu_si128(a2_lo, alpha_mask, ptr);
      _mm_maskmoveu_si128(a2_hi, alpha_mask, ptr + 16);
      // accumulate 8 alpha 'and' in parallel
      all_alphas8 = _mm_and_si128(all_alphas8, a0);
      i += 8;
    }
    for (; i < width; ++i) {
      const uint32_t alpha_value = alpha[i];
      dst[4 * i] = alpha_value;
      alpha_and &= alpha_value;
    }
    alpha += alpha_stride;
    dst += dst_stride;
  }
  // Combine the eight alpha 'and' into a 8-bit mask.
  alpha_and &= _mm_movemask_epi8(_mm_cmpeq_epi8(all_alphas8, all_0xff)) & 0xff;
  return (alpha_and != 0xff ||
          _mm_movemask_epi8(_mm_cmpeq_epi8(all_alphas16, all_0xff)) != 0xffff);
}